

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::handleCall<wasm::Call>
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,Call *curr,
          Type params)

{
  size_t sVar1;
  Expression **childp;
  Type *pTVar2;
  size_t i;
  ulong index;
  Type local_38;
  Type params_local;
  
  local_38.id = params.id;
  sVar1 = wasm::Type::size(&local_38);
  if (sVar1 == (curr->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements) {
    index = 0;
    while( true ) {
      sVar1 = wasm::Type::size(&local_38);
      if (sVar1 <= index) break;
      childp = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                         (&(curr->operands).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          ,index);
      pTVar2 = wasm::Type::operator[](&local_38,index);
      IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                ((ConstraintCollector *)this,childp,(Type)pTVar2->id);
      index = index + 1;
    }
    return;
  }
  __assert_fail("params.size() == curr->operands.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,0xa2,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::handleCall(T *, Type) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector, T = wasm::Call]"
               );
}

Assistant:

void handleCall(T* curr, Type params) {
    assert(params.size() == curr->operands.size());
    for (size_t i = 0; i < params.size(); ++i) {
      note(&curr->operands[i], params[i]);
    }
  }